

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ImDrawList *pIVar1;
  bool bVar2;
  value_type_conflict4 *pvVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  int local_40;
  int j;
  ImDrawList *cmd_list;
  undefined1 local_20 [4];
  int i;
  ImVector<ImDrawVert> new_vtx_buffer;
  ImDrawData *this_local;
  
  new_vtx_buffer.Data = (ImDrawVert *)this;
  ImVector<ImDrawVert>::ImVector((ImVector<ImDrawVert> *)local_20);
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  for (cmd_list._4_4_ = 0; cmd_list._4_4_ < this->CmdListsCount; cmd_list._4_4_ = cmd_list._4_4_ + 1
      ) {
    pIVar1 = this->CmdLists[cmd_list._4_4_];
    bVar2 = ImVector<unsigned_short>::empty(&pIVar1->IdxBuffer);
    if (!bVar2) {
      ImVector<ImDrawVert>::resize((ImVector<ImDrawVert> *)local_20,(pIVar1->IdxBuffer).Size);
      for (local_40 = 0; local_40 < (pIVar1->IdxBuffer).Size; local_40 = local_40 + 1) {
        pvVar3 = ImVector<unsigned_short>::operator[](&pIVar1->IdxBuffer,local_40);
        pvVar4 = ImVector<ImDrawVert>::operator[](&pIVar1->VtxBuffer,(uint)*pvVar3);
        pvVar5 = ImVector<ImDrawVert>::operator[]((ImVector<ImDrawVert> *)local_20,local_40);
        pvVar5->pos = pvVar4->pos;
        pvVar5->uv = pvVar4->uv;
        pvVar5->col = pvVar4->col;
      }
      ImVector<ImDrawVert>::swap(&pIVar1->VtxBuffer,(ImVector<ImDrawVert> *)local_20);
      ImVector<unsigned_short>::resize(&pIVar1->IdxBuffer,0);
      this->TotalVtxCount = (pIVar1->VtxBuffer).Size + this->TotalVtxCount;
    }
  }
  ImVector<ImDrawVert>::~ImVector((ImVector<ImDrawVert> *)local_20);
  return;
}

Assistant:

void ImDrawData::DeIndexAllBuffers()
{
    ImVector<ImDrawVert> new_vtx_buffer;
    TotalVtxCount = TotalIdxCount = 0;
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        if (cmd_list->IdxBuffer.empty())
            continue;
        new_vtx_buffer.resize(cmd_list->IdxBuffer.Size);
        for (int j = 0; j < cmd_list->IdxBuffer.Size; j++)
            new_vtx_buffer[j] = cmd_list->VtxBuffer[cmd_list->IdxBuffer[j]];
        cmd_list->VtxBuffer.swap(new_vtx_buffer);
        cmd_list->IdxBuffer.resize(0);
        TotalVtxCount += cmd_list->VtxBuffer.Size;
    }
}